

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

fdb_status filemgr_destroy_file(char *filename,filemgr_config *config,hash *destroy_file_set)

{
  ushort uVar1;
  avl_node *filename_00;
  hash *hash;
  fdb_status fVar2;
  int iVar3;
  fdb_status fVar4;
  hash_elem *phVar5;
  hash_elem *phVar6;
  filemgr_ops *pfVar7;
  size_t sVar8;
  filemgr_config *this;
  avl_node **__lock;
  filemgr_config local_6a8;
  filemgr local_648;
  char *local_358;
  filemgr query;
  hash to_destroy_files;
  
  this = (filemgr_config *)&local_358;
  local_358 = filename;
  if (destroy_file_set == (hash *)0x0) {
    local_648.fhandle_idx_lock = 0x12596e;
    local_648._748_4_ = 0;
    hash_init((hash *)&query.fhandle_idx_lock,0x400,_file_hash,_file_cmp);
    local_648.fhandle_idx_lock = 0x125988;
    local_648._748_4_ = 0;
    phVar5 = hash_find((hash *)&query.fhandle_idx_lock,(hash_elem *)&query.ops);
    hash = (hash *)&query.fhandle_idx_lock;
    if (phVar5 != (hash_elem *)0x0) {
      local_648.fhandle_idx_lock = 0x125996;
      local_648._748_4_ = 0;
      hash_free((hash *)&query.fhandle_idx_lock);
      return FDB_RESULT_SUCCESS;
    }
  }
  else {
    local_648.fhandle_idx_lock = 0x125941;
    local_648._748_4_ = 0;
    phVar5 = hash_find(destroy_file_set,(hash_elem *)&query.ops);
    hash = destroy_file_set;
    if (phVar5 != (hash_elem *)0x0) {
      return FDB_RESULT_SUCCESS;
    }
  }
  local_648.fhandle_idx_lock = 0x1259a9;
  local_648._748_4_ = 0;
  hash_insert(hash,(hash_elem *)&query.ops);
  local_648.fhandle_idx_lock = 0x1259b8;
  local_648._748_4_ = 0;
  phVar5 = hash_find(&::hash,(hash_elem *)&query.ops);
  if (phVar5 == (hash_elem *)0x0) {
    local_6a8.do_not_cache_doc_blocks = true;
    local_6a8._89_3_ = 0x125a;
    local_6a8.num_blocks_readahead = 0;
    memset(&local_648,0,0x2f0);
    local_6a8.do_not_cache_doc_blocks = true;
    local_6a8._89_3_ = 0x125a;
    local_6a8.num_blocks_readahead = 0;
    local_648.filename = filename;
    local_648.ops = get_filemgr_ops();
    local_6a8.do_not_cache_doc_blocks = true;
    local_6a8._89_3_ = 0x125a;
    local_6a8.num_blocks_readahead = 0;
    local_648.fd = (*(local_648.ops)->open)(local_648.filename,2,0x1b6);
    local_648.blocksize = global_config.blocksize;
    this = &local_6a8;
    local_648.config = this;
    filemgr_config::operator=(this,config);
    fdb_init_encryptor(&local_648.encryption,&config->encryption_key);
    if (local_648.fd < FDB_RESULT_SUCCESS) {
      fVar2 = FDB_RESULT_SUCCESS;
      if (local_648.fd != FDB_RESULT_NO_SUCH_FILE) {
        if (destroy_file_set != (hash *)0x0) {
          return local_648.fd;
        }
        hash_free((hash *)&query.fhandle_idx_lock);
        return local_648.fd;
      }
      goto LAB_00125bac;
    }
    local_648.pos.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)(*(local_648.ops)->goto_eof)(local_648.fd);
    if ((long)local_648.pos.super___atomic_base<unsigned_long>._M_i < 0) goto LAB_001259f5;
    LOCK();
    UNLOCK();
    local_648.crc_mode = CRC32;
    fVar2 = _filemgr_load_sb(&local_648,(err_log_callback *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      if (destroy_file_set == (hash *)0x0) {
        hash_free((hash *)&query.fhandle_idx_lock);
      }
      (*(local_648.ops)->close)(local_648.fd);
      return fVar2;
    }
    fVar2 = _filemgr_read_header(&local_648,(err_log_callback *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      if (destroy_file_set == (hash *)0x0) {
        hash_free((hash *)&query.fhandle_idx_lock);
      }
      (*(local_648.ops)->close)(local_648.fd);
      if (sb_ops.release == (_func_fdb_status_filemgr_ptr *)0x0) {
        return fVar2;
      }
      if (local_648.sb == (superblock *)0x0) {
        return fVar2;
      }
      (*sb_ops.release)(&local_648);
      return fVar2;
    }
    fVar2 = FDB_RESULT_SUCCESS;
    if (local_648.header.data != (void *)0x0) {
      sVar8 = ver_get_new_filename_off(local_648.version);
      if (*(short *)((long)local_648.header.data + sVar8 + 2) == 0) {
        fVar2 = FDB_RESULT_SUCCESS;
      }
      else {
        uVar1 = *(ushort *)((long)local_648.header.data + sVar8);
        fVar2 = filemgr_destroy_file
                          ((char *)((long)((long)local_648.header.data + sVar8) +
                                   (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8) + 4),config,hash);
      }
      free(local_648.header.data);
    }
    (*(local_648.ops)->close)(local_648.fd);
    if ((sb_ops.release != (_func_fdb_status_filemgr_ptr *)0x0) &&
       (local_648.sb != (superblock *)0x0)) {
      (*sb_ops.release)(&local_648);
    }
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00125bac;
    fVar4 = filemgr_does_file_exist(filename);
    fVar2 = FDB_RESULT_SUCCESS;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00125bac;
  }
  else {
    __lock = &phVar5[7].avl.left;
    local_648.fhandle_idx_lock = 0x1259d6;
    local_648._748_4_ = 0;
    pthread_spin_lock((pthread_spinlock_t *)__lock);
    iVar3 = *(int *)&phVar5[-10].avl.left;
    local_648.fhandle_idx_lock = 0x1259e6;
    local_648._748_4_ = 0;
    pthread_spin_unlock((pthread_spinlock_t *)__lock);
    if (iVar3 != 0) {
      local_648.pos.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)0xffffffe9;
      this = (filemgr_config *)&local_358;
LAB_001259f5:
      if (destroy_file_set != (hash *)0x0) {
        return SUB84(local_648.pos.super___atomic_base<unsigned_long>._M_i,0);
      }
      this[-1].do_not_cache_doc_blocks = true;
      *(undefined3 *)&this[-1].field_0x59 = 0x125a;
      this[-1].num_blocks_readahead = 0;
      hash_free((hash *)&query.fhandle_idx_lock);
      return SUB84(local_648.pos.super___atomic_base<unsigned_long>._M_i,0);
    }
    filename_00 = phVar5[1].avl.right;
    if (filename_00 != (avl_node *)0x0) {
      local_648.fhandle_idx_lock = 0x125b1c;
      local_648._748_4_ = 0;
      fVar2 = filemgr_destroy_file((char *)filename_00,config,hash);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        local_648.pos.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(ulong)(uint)fVar2;
        this = (filemgr_config *)&local_358;
        goto LAB_001259f5;
      }
    }
    local_648.fhandle_idx_lock = 0x125b37;
    local_648._748_4_ = 0;
    phVar6 = hash_remove(&::hash,phVar5);
    if (phVar6 == (hash_elem *)0x0) {
      local_648.fhandle_idx_lock = 0x125b59;
      local_648._748_4_ = 0;
      fdb_assert_die("e",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                     ,0xb4e,0,0);
    }
    local_648.fhandle_idx_lock = 0x125b61;
    local_648._748_4_ = 0;
    filemgr_free_func(phVar5);
    local_648.fhandle_idx_lock = 0x125b66;
    local_648._748_4_ = 0;
    pfVar7 = get_filemgr_ops();
    fVar2 = FDB_RESULT_SUCCESS;
    local_648.fhandle_idx_lock = 0x125b7c;
    local_648._748_4_ = 0;
    iVar3 = (*pfVar7->open)(filename,0,0x124);
    if (iVar3 < 0) goto LAB_00125bac;
    local_648.fhandle_idx_lock = 0x125b86;
    local_648._748_4_ = 0;
    (*pfVar7->close)(iVar3);
    this = (filemgr_config *)&local_358;
  }
  this[-1].do_not_cache_doc_blocks = true;
  *(undefined3 *)&this[-1].field_0x59 = 0x125b;
  this[-1].num_blocks_readahead = 0;
  iVar3 = remove(filename);
  fVar2 = FDB_RESULT_FILE_REMOVE_FAIL;
  if (iVar3 == 0) {
    fVar2 = FDB_RESULT_SUCCESS;
  }
LAB_00125bac:
  if (destroy_file_set == (hash *)0x0) {
    this[-1].do_not_cache_doc_blocks = true;
    *(undefined3 *)&this[-1].field_0x59 = 0x125b;
    this[-1].num_blocks_readahead = 0;
    hash_free((hash *)&query.fhandle_idx_lock);
  }
  return fVar2;
}

Assistant:

fdb_status filemgr_destroy_file(char *filename,
                                struct filemgr_config *config,
                                struct hash *destroy_file_set)
{
    struct filemgr *file = NULL;
    struct hash to_destroy_files;
    struct hash *destroy_set = (destroy_file_set ? destroy_file_set :
                                                  &to_destroy_files);
    struct filemgr query;
    struct hash_elem *e = NULL;
    fdb_status status = FDB_RESULT_SUCCESS;
    char *old_filename = NULL;

    if (!destroy_file_set) { // top level or non-recursive call
        hash_init(destroy_set, NBUCKET, _file_hash, _file_cmp);
    }

    query.filename = filename;
    // check whether file is already being destroyed in parent recursive call
    e = hash_find(destroy_set, &query.e);
    if (e) { // Duplicate filename found, nothing to be done in this call
        if (!destroy_file_set) { // top level or non-recursive call
            hash_free(destroy_set);
        }
        return status;
    } else {
        // Remember file. Stack value ok IFF single direction recursion
        hash_insert(destroy_set, &query.e);
    }

    // check global list of known files to see if it is already opened or not
    e = hash_find(&hash, &query.e);
    if (e) {
        // already opened (return existing structure)
        file = _get_entry(e, struct filemgr, e);

        spin_lock(&file->lock);
        if (atomic_get_uint32_t(&file->ref_count)) {
            spin_unlock(&file->lock);
            status = FDB_RESULT_FILE_IS_BUSY;
            if (!destroy_file_set) { // top level or non-recursive call
                hash_free(destroy_set);
            }
            return status;
        }
        spin_unlock(&file->lock);
        if (file->old_filename) {
            status = filemgr_destroy_file(file->old_filename, config,
                                          destroy_set);
            if (status != FDB_RESULT_SUCCESS) {
                if (!destroy_file_set) { // top level or non-recursive call
                    hash_free(destroy_set);
                }
                return status;
            }
        }

        // Cleanup file from in-memory as well as on-disk
        e = hash_remove(&hash, &file->e);
        fdb_assert(e, e, 0);
        filemgr_free_func(&file->e);
        if (filemgr_does_file_exist(filename) == FDB_RESULT_SUCCESS) {
            if (remove(filename)) {
                status = FDB_RESULT_FILE_REMOVE_FAIL;
            }
        }
    } else { // file not in memory, read on-disk to destroy older versions..
        file = (struct filemgr *)alca(struct filemgr, 1);
        memset(file, 0x0, sizeof(struct filemgr));
        file->filename = filename;
        file->ops = get_filemgr_ops();
        file->fd = file->ops->open(file->filename, O_RDWR, 0666);
        file->blocksize = global_config.blocksize;
        file->config = (struct filemgr_config *)alca(struct filemgr_config, 1);
        *file->config = *config;
        fdb_init_encryptor(&file->encryption, &config->encryption_key);
        if (file->fd < 0) {
            if (file->fd != FDB_RESULT_NO_SUCH_FILE) {
                if (!destroy_file_set) { // top level or non-recursive call
                    hash_free(destroy_set);
                }
                return (fdb_status) file->fd;
            }
        } else { // file successfully opened, seek to end to get DB header
            cs_off_t offset = file->ops->goto_eof(file->fd);
            if (offset < 0) {
                if (!destroy_file_set) { // top level or non-recursive call
                    hash_free(destroy_set);
                }
                return (fdb_status) offset;
            } else { // Need to read DB header which contains old filename
                atomic_store_uint64_t(&file->pos, offset);
                // initialize CRC mode
                if (file->config && file->config->options & FILEMGR_CREATE_CRC32) {
                    file->crc_mode = CRC32;
                } else {
                    file->crc_mode = CRC_DEFAULT;
                }

                status = _filemgr_load_sb(file, NULL);
                if (status != FDB_RESULT_SUCCESS) {
                    if (!destroy_file_set) { // top level or non-recursive call
                        hash_free(destroy_set);
                    }
                    file->ops->close(file->fd);
                    return status;
                }

                status = _filemgr_read_header(file, NULL);
                if (status != FDB_RESULT_SUCCESS) {
                    if (!destroy_file_set) { // top level or non-recursive call
                        hash_free(destroy_set);
                    }
                    file->ops->close(file->fd);
                    if (sb_ops.release && file->sb) {
                        sb_ops.release(file);
                    }
                    return status;
                }
                if (file->header.data) {
                    size_t new_fnamelen_off = ver_get_new_filename_off(file->
                                                                      version);
                    size_t old_fnamelen_off = new_fnamelen_off + 2;
                    uint16_t *new_filename_len_ptr = (uint16_t *)((char *)
                                                     file->header.data
                                                     + new_fnamelen_off);
                    uint16_t new_filename_len =
                                      _endian_decode(*new_filename_len_ptr);
                    uint16_t *old_filename_len_ptr = (uint16_t *)((char *)
                                                     file->header.data
                                                     + old_fnamelen_off);
                    uint16_t old_filename_len =
                                      _endian_decode(*old_filename_len_ptr);
                    old_filename = (char *)file->header.data + old_fnamelen_off
                                   + 2 + new_filename_len;
                    if (old_filename_len) {
                        status = filemgr_destroy_file(old_filename, config,
                                                      destroy_set);
                    }
                    free(file->header.data);
                }
                file->ops->close(file->fd);
                if (sb_ops.release && file->sb) {
                    sb_ops.release(file);
                }
                if (status == FDB_RESULT_SUCCESS) {
                    if (filemgr_does_file_exist(filename)
                                               == FDB_RESULT_SUCCESS) {
                        if (remove(filename)) {
                            status = FDB_RESULT_FILE_REMOVE_FAIL;
                        }
                    }
                }
            }
        }
    }

    if (!destroy_file_set) { // top level or non-recursive call
        hash_free(destroy_set);
    }

    return status;
}